

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::ShaderTextureFunctionCase::initTexture(ShaderTextureFunctionCase *this)

{
  undefined8 uVar1;
  Function FVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Texture2D *this_00;
  Texture2DArray *this_01;
  Texture3D *this_02;
  TextureCube *this_03;
  int iVar6;
  int iVar7;
  int level;
  long lVar8;
  long lVar9;
  int layer;
  long lVar10;
  IVec4 *a;
  bool bVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  CubeFaceFloatCoords CVar17;
  CubeFaceFloatCoords CVar18;
  CubeFaceFloatCoords CVar19;
  float local_1a0;
  Vec2 f;
  IVec2 viewportSize;
  Vec4 colorB_1;
  Vec4 colorA_1;
  undefined4 local_150;
  Vec4 colorB_3;
  Vec4 cBias;
  Vec4 colorB;
  Vector<float,_4> local_100;
  Vec4 colorA;
  undefined4 local_e0;
  Vec4 cScale;
  TextureFormatInfo fmtInfo;
  TextureFormat texFmt;
  
  if ((initTexture()::texCubeSwz == '\0') &&
     (iVar5 = __cxa_guard_acquire(&initTexture()::texCubeSwz), iVar5 != 0)) {
    initTexture::texCubeSwz[0].m_data[0] = _DAT_017174d0;
    initTexture::texCubeSwz[0].m_data[1] = _UNK_017174d4;
    initTexture::texCubeSwz[0].m_data[2] = _UNK_017174d8;
    initTexture::texCubeSwz[0].m_data[3] = _UNK_017174dc;
    initTexture::texCubeSwz[1].m_data = (int  [4])ZEXT816((ulong)0x100000001);
    initTexture::texCubeSwz[2].m_data[0] = _DAT_016bf8e0;
    initTexture::texCubeSwz[2].m_data[1] = _UNK_016bf8e4;
    initTexture::texCubeSwz[2].m_data[2] = _UNK_016bf8e8;
    initTexture::texCubeSwz[2].m_data[3] = _UNK_016bf8ec;
    initTexture::texCubeSwz[3].m_data[0] = _DAT_016aff20;
    initTexture::texCubeSwz[3].m_data[1] = _UNK_016aff24;
    initTexture::texCubeSwz[3].m_data[2] = _UNK_016aff28;
    initTexture::texCubeSwz[3].m_data[3] = _UNK_016aff2c;
    initTexture::texCubeSwz[4].m_data[0] =
         glcts::GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest::checkResult::
         gather_offsets_x[0];
    initTexture::texCubeSwz[4].m_data[1] =
         glcts::GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest::checkResult::
         gather_offsets_x[1];
    initTexture::texCubeSwz[4].m_data[2] =
         glcts::GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest::checkResult::
         gather_offsets_x[2];
    initTexture::texCubeSwz[4].m_data[3] =
         glcts::GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest::checkResult::
         gather_offsets_x[3];
    initTexture::texCubeSwz[5].m_data[0] = _DAT_016951a0;
    initTexture::texCubeSwz[5].m_data[1] = _UNK_016951a4;
    initTexture::texCubeSwz[5].m_data[2] = _UNK_016951a8;
    initTexture::texCubeSwz[5].m_data[3] = _UNK_016951ac;
    __cxa_guard_release(&initTexture()::texCubeSwz);
  }
  texFmt = glu::mapGLInternalFormat((this->m_textureSpec).format);
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  deqp::gls::ShaderRenderCase::getViewportSize((ShaderRenderCase *)&viewportSize);
  FVar2 = (this->m_lookupSpec).function;
  bVar12 = (this->super_ShaderRenderCase).m_isVertexCase != false;
  bVar11 = FUNCTION_TEXTUREPROJ3 < FVar2;
  if (((byte)(0x1b6 >> ((byte)FVar2 & 0x1f)) & FVar2 < FUNCTION_TEXELFETCH) == 1) {
    fVar13 = 1.0 / (this->m_lookupSpec).minCoord.m_data[FVar2 == FUNCTION_TEXTUREPROJ3 ^ 3];
  }
  else {
    fVar13 = 1.0;
  }
  switch((this->m_textureSpec).type) {
  case TEXTURETYPE_2D:
    fVar15 = 0.0;
    if (bVar11 || bVar12) {
      iVar7 = (this->m_textureSpec).numLevels + -1;
      iVar5 = 1;
      if (1 < iVar7) {
        iVar5 = iVar7;
      }
      fVar15 = 1.0 / (float)iVar5;
    }
    tcu::operator-((tcu *)&cScale,&fmtInfo.valueMax,&fmtInfo.valueMin);
    tcu::Vector<float,_4>::Vector(&cBias,&fmtInfo.valueMin);
    iVar5 = (this->m_textureSpec).width;
    iVar7 = (this->m_textureSpec).height;
    iVar6 = iVar5 / 4;
    iVar3 = iVar7 / 4;
    if (iVar6 < iVar3) {
      iVar3 = iVar6;
    }
    this_00 = (Texture2D *)operator_new(0x70);
    glu::Texture2D::Texture2D
              (this_00,(this->super_ShaderRenderCase).m_renderCtx,(this->m_textureSpec).format,iVar5
               ,iVar7);
    this->m_texture2D = this_00;
    lVar10 = 0;
    for (lVar8 = 0; lVar8 < (this->m_textureSpec).numLevels; lVar8 = lVar8 + 1) {
      fVar16 = (float)(int)lVar8 * fVar15;
      fVar14 = 1.0 - fVar16;
      colorA_1.m_data[0] = fVar16;
      colorA_1.m_data[1] = fVar14;
      colorA_1.m_data[2] = fVar16;
      colorA_1.m_data[3] = fVar14;
      tcu::operator*((tcu *)&colorB,&cScale,(Vector<float,_4> *)&colorA_1);
      tcu::operator+((tcu *)&colorA,&cBias,(Vector<float,_4> *)&colorB);
      colorB_1.m_data[0] = fVar14;
      colorB_1.m_data[1] = fVar16;
      colorB_1.m_data[2] = fVar14;
      colorB_1.m_data[3] = fVar16;
      tcu::operator*((tcu *)&colorA_1,&cScale,&colorB_1);
      tcu::operator+((tcu *)&colorB,&cBias,(Vector<float,_4> *)&colorA_1);
      tcu::Texture2D::allocLevel(&this->m_texture2D->m_refTexture,(int)lVar8);
      iVar5 = iVar3 >> ((byte)lVar8 & 0x1f);
      if (iVar5 < 2) {
        iVar5 = 1;
      }
      tcu::fillWithGrid((PixelBufferAccess *)
                        ((long)(((this->m_texture2D->m_refTexture).super_TextureLevelPyramid.
                                 m_access.
                                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_ConstPixelBufferAccess).m_size.m_data + lVar10 + -8),iVar5,
                        &colorA,&colorB);
      lVar10 = lVar10 + 0x28;
    }
    (*this->m_texture2D->_vptr_Texture2D[2])();
    fVar13 = glu::TextureTestUtil::computeLodFromDerivates
                       (LODMODE_EXACT,
                        ((float)(this->m_textureSpec).width *
                        ((this->m_lookupSpec).maxCoord.m_data[0] -
                        (this->m_lookupSpec).minCoord.m_data[0]) * fVar13) /
                        (float)viewportSize.m_data[0],0.0,0.0,
                        ((float)(this->m_textureSpec).height *
                        ((this->m_lookupSpec).maxCoord.m_data[1] -
                        (this->m_lookupSpec).minCoord.m_data[1]) * fVar13) /
                        (float)viewportSize.m_data[1]);
    (this->m_lookupParams).lod = fVar13;
    deqp::gls::TextureBinding::TextureBinding
              ((TextureBinding *)&colorA,this->m_texture2D,&(this->m_textureSpec).sampler);
    break;
  case TEXTURETYPE_CUBE_MAP:
    local_1a0 = 0.0;
    if (bVar11 || bVar12) {
      iVar7 = (this->m_textureSpec).numLevels + -1;
      iVar5 = 1;
      if (1 < iVar7) {
        iVar5 = iVar7;
      }
      local_1a0 = 1.0 / (float)iVar5;
    }
    tcu::operator-((tcu *)&cScale,&fmtInfo.valueMax,&fmtInfo.valueMin);
    tcu::Vector<float,_4>::Vector(&cBias,&fmtInfo.valueMin);
    tcu::operator*((tcu *)&colorA,0.5,(Vector<float,_4> *)&cScale);
    tcu::operator+((tcu *)&colorB,&cBias,(Vector<float,_4> *)&colorA);
    iVar5 = (this->m_textureSpec).width;
    iVar3 = iVar5 / 4;
    iVar7 = (this->m_textureSpec).height / 4;
    if (iVar3 < iVar7) {
      iVar7 = iVar3;
    }
    this_03 = (TextureCube *)operator_new(0x180);
    glu::TextureCube::TextureCube
              (this_03,(this->super_ShaderRenderCase).m_renderCtx,(this->m_textureSpec).format,iVar5
              );
    this->m_textureCube = this_03;
    for (lVar8 = 0; lVar8 < (this->m_textureSpec).numLevels; lVar8 = lVar8 + 1) {
      f.m_data[0] = (float)(int)lVar8 * local_1a0;
      f.m_data[1] = 1.0 - f.m_data[0];
      iVar5 = iVar7 >> ((byte)lVar8 & 0x1f);
      if (iVar5 < 2) {
        iVar5 = 1;
      }
      lVar9 = 0;
      a = initTexture::texCubeSwz;
      for (lVar10 = 0; lVar10 != 6; lVar10 = lVar10 + 1) {
        tcu::operator-((tcu *)&colorA_1,1,a);
        colorB_3.m_data[0] = f.m_data[a->m_data[0]];
        colorB_3.m_data[1] = f.m_data[a->m_data[1]];
        colorB_3.m_data[2] = f.m_data[a->m_data[2]];
        colorB_3.m_data[3] = f.m_data[a->m_data[3]];
        tcu::operator*((tcu *)&colorA,&cScale,(Vector<float,_4> *)&colorB_3);
        tcu::operator+((tcu *)&colorB_1,&cBias,(Vector<float,_4> *)&colorA);
        local_100.m_data[0] = f.m_data[(int)colorA_1.m_data[0]];
        local_100.m_data[1] = f.m_data[(int)colorA_1.m_data[1]];
        local_100.m_data[2] = f.m_data[(int)colorA_1.m_data[2]];
        local_100.m_data[3] = f.m_data[(int)colorA_1.m_data[3]];
        tcu::operator*((tcu *)&colorA,&cScale,&local_100);
        tcu::operator+((tcu *)&colorB_3,&cBias,(Vector<float,_4> *)&colorA);
        tcu::TextureCube::allocLevel(&this->m_textureCube->m_refTexture,(CubeFace)lVar10,(int)lVar8)
        ;
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)&colorA,
                   (ConstPixelBufferAccess *)
                   (lVar8 * 0x28 +
                   *(long *)((long)&(this->m_textureCube->m_refTexture).m_access[0].
                                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar9)));
        iVar3 = (int)colorA.m_data[2] + -1;
        tcu::fillWithGrid((PixelBufferAccess *)&colorA,iVar5,&colorB_1,&colorB_3);
        tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&colorA,&colorB,0,0,0);
        tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&colorA,&colorB,0,iVar3,0);
        tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&colorA,&colorB,iVar3,0,0);
        tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&colorA,&colorB,iVar3,iVar3,0);
        a = a + 1;
        lVar9 = lVar9 + 0x18;
      }
    }
    glu::TextureCube::upload(this->m_textureCube);
    colorA.m_data[2] = (this->m_lookupSpec).minCoord.m_data[2] * fVar13;
    uVar1 = *(undefined8 *)(this->m_lookupSpec).minCoord.m_data;
    colorA.m_data[0] = (float)uVar1 * fVar13;
    colorA.m_data[1] = (float)((ulong)uVar1 >> 0x20) * fVar13;
    CVar17 = tcu::getCubeFaceCoords((Vec3 *)&colorA);
    colorA.m_data[2] = (this->m_lookupSpec).minCoord.m_data[2] * fVar13;
    colorA.m_data[0] = (this->m_lookupSpec).maxCoord.m_data[0] * fVar13;
    colorA.m_data[1] = (this->m_lookupSpec).minCoord.m_data[1] * fVar13;
    CVar18 = tcu::getCubeFaceCoords((Vec3 *)&colorA);
    colorA.m_data[2] = fVar13 * (this->m_lookupSpec).minCoord.m_data[2];
    colorA.m_data[0] = (this->m_lookupSpec).minCoord.m_data[0] * fVar13;
    colorA.m_data[1] = (this->m_lookupSpec).maxCoord.m_data[1] * fVar13;
    CVar19 = tcu::getCubeFaceCoords((Vec3 *)&colorA);
    fVar13 = glu::TextureTestUtil::computeLodFromDerivates
                       (LODMODE_EXACT,
                        ((float)(this->m_textureSpec).width * (CVar18.s - CVar17.s)) /
                        (float)viewportSize.m_data[0],0.0,0.0,
                        ((float)(this->m_textureSpec).height * (CVar19.t - CVar17.t)) /
                        (float)viewportSize.m_data[1]);
    (this->m_lookupParams).lod = fVar13;
    deqp::gls::TextureBinding::TextureBinding
              ((TextureBinding *)&colorA,this->m_textureCube,&(this->m_textureSpec).sampler);
    break;
  case TEXTURETYPE_2D_ARRAY:
    iVar5 = (this->m_textureSpec).depth;
    local_150 = 0.0;
    if (bVar11 || bVar12) {
      iVar3 = (this->m_textureSpec).numLevels + -1;
      iVar7 = 1;
      if (1 < iVar3) {
        iVar7 = iVar3;
      }
      local_150 = 1.0 / (float)(iVar7 * iVar5);
    }
    tcu::operator-((tcu *)&cBias,&fmtInfo.valueMax,&fmtInfo.valueMin);
    tcu::Vector<float,_4>::Vector(&colorB,&fmtInfo.valueMin);
    iVar7 = (this->m_textureSpec).width;
    iVar3 = (this->m_textureSpec).height;
    iVar4 = iVar7 / 4;
    iVar6 = iVar3 / 4;
    if (iVar4 < iVar6) {
      iVar6 = iVar4;
    }
    this_01 = (Texture2DArray *)operator_new(0x70);
    glu::Texture2DArray::Texture2DArray
              (this_01,(this->super_ShaderRenderCase).m_renderCtx,(this->m_textureSpec).format,iVar7
               ,iVar3,(this->m_textureSpec).depth);
    this->m_texture2DArray = this_01;
    for (lVar8 = 0; lVar8 < (this->m_textureSpec).numLevels; lVar8 = lVar8 + 1) {
      tcu::Texture2DArray::allocLevel(&this->m_texture2DArray->m_refTexture,(int)lVar8);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)&colorA,
                 &(this->m_texture2DArray->m_refTexture).super_TextureLevelPyramid.m_access.
                  super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar8].super_ConstPixelBufferAccess);
      iVar7 = iVar6 >> ((byte)lVar8 & 0x1f);
      if (iVar7 < 2) {
        iVar7 = 1;
      }
      for (iVar3 = 0; iVar3 < (int)local_e0; iVar3 = iVar3 + 1) {
        fVar14 = (float)iVar3 * (1.0 / (float)iVar5) + (float)(int)lVar8 * (float)local_150;
        fVar15 = 1.0 - fVar14;
        colorB_1.m_data[0] = fVar14;
        colorB_1.m_data[1] = fVar15;
        colorB_1.m_data[2] = fVar14;
        colorB_1.m_data[3] = fVar15;
        tcu::operator*((tcu *)&cScale,&cBias,(Vector<float,_4> *)&colorB_1);
        tcu::operator+((tcu *)&colorA_1,&colorB,(Vector<float,_4> *)&cScale);
        colorB_3.m_data[0] = fVar15;
        colorB_3.m_data[1] = fVar14;
        colorB_3.m_data[2] = fVar15;
        colorB_3.m_data[3] = fVar14;
        tcu::operator*((tcu *)&cScale,&cBias,&colorB_3);
        tcu::operator+((tcu *)&colorB_1,&colorB,(Vector<float,_4> *)&cScale);
        tcu::getSubregion((PixelBufferAccess *)&cScale,(PixelBufferAccess *)&colorA,0,0,iVar3,
                          (int)colorA.m_data[2],(int)colorA.m_data[3],1);
        tcu::fillWithGrid((PixelBufferAccess *)&cScale,iVar7,&colorA_1,&colorB_1);
      }
    }
    glu::Texture2DArray::upload(this->m_texture2DArray);
    fVar13 = glu::TextureTestUtil::computeLodFromDerivates
                       (LODMODE_EXACT,
                        ((float)(this->m_textureSpec).width *
                        ((this->m_lookupSpec).maxCoord.m_data[0] -
                        (this->m_lookupSpec).minCoord.m_data[0]) * fVar13) /
                        (float)viewportSize.m_data[0],0.0,0.0,
                        ((float)(this->m_textureSpec).height *
                        ((this->m_lookupSpec).maxCoord.m_data[1] -
                        (this->m_lookupSpec).minCoord.m_data[1]) * fVar13) /
                        (float)viewportSize.m_data[1]);
    (this->m_lookupParams).lod = fVar13;
    deqp::gls::TextureBinding::TextureBinding
              ((TextureBinding *)&colorA,this->m_texture2DArray,&(this->m_textureSpec).sampler);
    break;
  case TEXTURETYPE_3D:
    fVar15 = 0.0;
    if (bVar11 || bVar12) {
      iVar5 = (this->m_textureSpec).numLevels + -1;
      if (iVar5 < 2) {
        iVar5 = 1;
      }
      fVar15 = 1.0 / (float)iVar5;
    }
    tcu::operator-((tcu *)&cScale,&fmtInfo.valueMax,&fmtInfo.valueMin);
    tcu::Vector<float,_4>::Vector(&cBias,&fmtInfo.valueMin);
    iVar5 = (this->m_textureSpec).width;
    iVar7 = (this->m_textureSpec).height;
    iVar6 = iVar5 / 2;
    iVar3 = iVar7 / 2;
    if (iVar6 < iVar3) {
      iVar3 = iVar6;
    }
    iVar6 = (this->m_textureSpec).depth;
    iVar4 = iVar6 / 2;
    if (iVar4 <= iVar3) {
      iVar3 = iVar4;
    }
    this_02 = (Texture3D *)operator_new(0x70);
    glu::Texture3D::Texture3D
              (this_02,(this->super_ShaderRenderCase).m_renderCtx,(this->m_textureSpec).format,iVar5
               ,iVar7,iVar6);
    this->m_texture3D = this_02;
    lVar10 = 0;
    for (lVar8 = 0; lVar8 < (this->m_textureSpec).numLevels; lVar8 = lVar8 + 1) {
      fVar16 = (float)(int)lVar8 * fVar15;
      fVar14 = 1.0 - fVar16;
      colorA_1.m_data[0] = fVar16;
      colorA_1.m_data[1] = fVar14;
      colorA_1.m_data[2] = fVar16;
      colorA_1.m_data[3] = fVar14;
      tcu::operator*((tcu *)&colorB,&cScale,(Vector<float,_4> *)&colorA_1);
      tcu::operator+((tcu *)&colorA,&cBias,(Vector<float,_4> *)&colorB);
      colorB_1.m_data[0] = fVar14;
      colorB_1.m_data[1] = fVar16;
      colorB_1.m_data[2] = fVar14;
      colorB_1.m_data[3] = fVar16;
      tcu::operator*((tcu *)&colorA_1,&cScale,&colorB_1);
      tcu::operator+((tcu *)&colorB,&cBias,(Vector<float,_4> *)&colorA_1);
      tcu::Texture3D::allocLevel(&this->m_texture3D->m_refTexture,(int)lVar8);
      iVar5 = iVar3 >> ((byte)lVar8 & 0x1f);
      if (iVar5 < 2) {
        iVar5 = 1;
      }
      tcu::fillWithGrid((PixelBufferAccess *)
                        ((long)(((this->m_texture3D->m_refTexture).super_TextureLevelPyramid.
                                 m_access.
                                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_ConstPixelBufferAccess).m_size.m_data + lVar10 + -8),iVar5,
                        &colorA,&colorB);
      lVar10 = lVar10 + 0x28;
    }
    glu::Texture3D::upload(this->m_texture3D);
    fVar15 = (float)(this->m_textureSpec).depth *
             ((this->m_lookupSpec).maxCoord.m_data[2] - (this->m_lookupSpec).minCoord.m_data[2]) *
             0.5 * fVar13;
    fVar13 = glu::TextureTestUtil::computeLodFromDerivates
                       (LODMODE_EXACT,
                        ((float)(this->m_textureSpec).width *
                        ((this->m_lookupSpec).maxCoord.m_data[0] -
                        (this->m_lookupSpec).minCoord.m_data[0]) * fVar13) /
                        (float)viewportSize.m_data[0],0.0,fVar15 / (float)viewportSize.m_data[0],0.0
                        ,((float)(this->m_textureSpec).height *
                         ((this->m_lookupSpec).maxCoord.m_data[1] -
                         (this->m_lookupSpec).minCoord.m_data[1]) * fVar13) /
                         (float)viewportSize.m_data[1],fVar15 / (float)viewportSize.m_data[1]);
    (this->m_lookupParams).lod = fVar13;
    deqp::gls::TextureBinding::TextureBinding
              ((TextureBinding *)&colorA,this->m_texture3D,&(this->m_textureSpec).sampler);
    break;
  default:
    goto switchD_00fe83a7_default;
  }
  std::vector<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>::
  emplace_back<deqp::gls::TextureBinding>
            (&(this->super_ShaderRenderCase).m_textures,(TextureBinding *)&colorA);
switchD_00fe83a7_default:
  *(undefined8 *)(this->m_lookupParams).scale.m_data = fmtInfo.lookupScale.m_data._0_8_;
  *(undefined8 *)((this->m_lookupParams).scale.m_data + 2) = fmtInfo.lookupScale.m_data._8_8_;
  *(undefined8 *)(this->m_lookupParams).bias.m_data = fmtInfo.lookupBias.m_data._0_8_;
  *(undefined8 *)((this->m_lookupParams).bias.m_data + 2) = fmtInfo.lookupBias.m_data._8_8_;
  *(undefined8 *)(this->m_lookupParams).offset.m_data =
       *(undefined8 *)(this->m_lookupSpec).offset.m_data;
  (this->m_lookupParams).offset.m_data[2] = (this->m_lookupSpec).offset.m_data[2];
  return;
}

Assistant:

void ShaderTextureFunctionCase::initTexture (void)
{
	static const IVec4 texCubeSwz[] =
	{
		IVec4(0,0,1,1),
		IVec4(1,1,0,0),
		IVec4(0,1,0,1),
		IVec4(1,0,1,0),
		IVec4(0,1,1,0),
		IVec4(1,0,0,1)
	};
	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(texCubeSwz) == tcu::CUBEFACE_LAST);

	tcu::TextureFormat		texFmt			= glu::mapGLInternalFormat(m_textureSpec.format);
	tcu::TextureFormatInfo	fmtInfo			= tcu::getTextureFormatInfo(texFmt);
	tcu::IVec2				viewportSize	= getViewportSize();
	bool					isProj			= functionHasProj(m_lookupSpec.function);
	bool					isAutoLod		= functionHasAutoLod(m_isVertexCase ? glu::SHADERTYPE_VERTEX : glu::SHADERTYPE_FRAGMENT,
																 m_lookupSpec.function); // LOD can vary significantly
	float					proj			= isProj ? 1.0f/m_lookupSpec.minCoord[m_lookupSpec.function == FUNCTION_TEXTUREPROJ3 ? 2 : 3] : 1.0f;

	switch (m_textureSpec.type)
	{
		case TEXTURETYPE_2D:
		{
			float	levelStep		= isAutoLod ? 0.0f : 1.0f / (float)de::max(1, m_textureSpec.numLevels-1);
			Vec4	cScale			= fmtInfo.valueMax-fmtInfo.valueMin;
			Vec4	cBias			= fmtInfo.valueMin;
			int		baseCellSize	= de::min(m_textureSpec.width/4, m_textureSpec.height/4);

			m_texture2D = new glu::Texture2D(m_renderCtx, m_textureSpec.format, m_textureSpec.width, m_textureSpec.height);
			for (int level = 0; level < m_textureSpec.numLevels; level++)
			{
				float	fA		= float(level)*levelStep;
				float	fB		= 1.0f-fA;
				Vec4	colorA	= cBias + cScale*Vec4(fA, fB, fA, fB);
				Vec4	colorB	= cBias + cScale*Vec4(fB, fA, fB, fA);

				m_texture2D->getRefTexture().allocLevel(level);
				tcu::fillWithGrid(m_texture2D->getRefTexture().getLevel(level), de::max(1, baseCellSize>>level), colorA, colorB);
			}
			m_texture2D->upload();

			// Compute LOD.
			float dudx = (m_lookupSpec.maxCoord[0]-m_lookupSpec.minCoord[0])*proj*(float)m_textureSpec.width	/ (float)viewportSize[0];
			float dvdy = (m_lookupSpec.maxCoord[1]-m_lookupSpec.minCoord[1])*proj*(float)m_textureSpec.height	/ (float)viewportSize[1];
			m_lookupParams.lod = computeLodFromDerivates(DEFAULT_LOD_MODE, dudx, 0.0f, 0.0f, dvdy);

			// Append to texture list.
			m_textures.push_back(gls::TextureBinding(m_texture2D, m_textureSpec.sampler));
			break;
		}

		case TEXTURETYPE_CUBE_MAP:
		{
			float	levelStep		= isAutoLod ? 0.0f : 1.0f / (float)de::max(1, m_textureSpec.numLevels-1);
			Vec4	cScale			= fmtInfo.valueMax-fmtInfo.valueMin;
			Vec4	cBias			= fmtInfo.valueMin;
			Vec4	cCorner			= cBias + cScale*0.5f;
			int		baseCellSize	= de::min(m_textureSpec.width/4, m_textureSpec.height/4);

			DE_ASSERT(m_textureSpec.width == m_textureSpec.height);
			m_textureCube = new glu::TextureCube(m_renderCtx, m_textureSpec.format, m_textureSpec.width);
			for (int level = 0; level < m_textureSpec.numLevels; level++)
			{
				float	fA		= float(level)*levelStep;
				float	fB		= 1.0f-fA;
				Vec2	f		(fA, fB);

				for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
				{
					const IVec4&	swzA	= texCubeSwz[face];
					IVec4			swzB	= 1-swzA;
					Vec4			colorA	= cBias + cScale*f.swizzle(swzA[0], swzA[1], swzA[2], swzA[3]);
					Vec4			colorB	= cBias + cScale*f.swizzle(swzB[0], swzB[1], swzB[2], swzB[3]);

					m_textureCube->getRefTexture().allocLevel((tcu::CubeFace)face, level);

					{
						const tcu::PixelBufferAccess	access		= m_textureCube->getRefTexture().getLevelFace(level, (tcu::CubeFace)face);
						const int						lastPix		= access.getWidth()-1;

						tcu::fillWithGrid(access, de::max(1, baseCellSize>>level), colorA, colorB);

						// Ensure all corners have identical colors in order to avoid dealing with ambiguous corner texel filtering
						access.setPixel(cCorner, 0, 0);
						access.setPixel(cCorner, 0, lastPix);
						access.setPixel(cCorner, lastPix, 0);
						access.setPixel(cCorner, lastPix, lastPix);
					}
				}
			}
			m_textureCube->upload();

			// Compute LOD \note Assumes that only single side is accessed and R is constant major axis.
			DE_ASSERT(de::abs(m_lookupSpec.minCoord[2] - m_lookupSpec.maxCoord[2]) < 0.005);
			DE_ASSERT(de::abs(m_lookupSpec.minCoord[0]) < de::abs(m_lookupSpec.minCoord[2]) && de::abs(m_lookupSpec.maxCoord[0]) < de::abs(m_lookupSpec.minCoord[2]));
			DE_ASSERT(de::abs(m_lookupSpec.minCoord[1]) < de::abs(m_lookupSpec.minCoord[2]) && de::abs(m_lookupSpec.maxCoord[1]) < de::abs(m_lookupSpec.minCoord[2]));

			tcu::CubeFaceFloatCoords	c00		= tcu::getCubeFaceCoords(Vec3(m_lookupSpec.minCoord[0]*proj, m_lookupSpec.minCoord[1]*proj, m_lookupSpec.minCoord[2]*proj));
			tcu::CubeFaceFloatCoords	c10		= tcu::getCubeFaceCoords(Vec3(m_lookupSpec.maxCoord[0]*proj, m_lookupSpec.minCoord[1]*proj, m_lookupSpec.minCoord[2]*proj));
			tcu::CubeFaceFloatCoords	c01		= tcu::getCubeFaceCoords(Vec3(m_lookupSpec.minCoord[0]*proj, m_lookupSpec.maxCoord[1]*proj, m_lookupSpec.minCoord[2]*proj));
			float						dudx	= (c10.s - c00.s)*(float)m_textureSpec.width	/ (float)viewportSize[0];
			float						dvdy	= (c01.t - c00.t)*(float)m_textureSpec.height	/ (float)viewportSize[1];

			m_lookupParams.lod = computeLodFromDerivates(DEFAULT_LOD_MODE, dudx, 0.0f, 0.0f, dvdy);

			m_textures.push_back(gls::TextureBinding(m_textureCube, m_textureSpec.sampler));
			break;
		}

		case TEXTURETYPE_2D_ARRAY:
		{
			float	layerStep		= 1.0f / (float)m_textureSpec.depth;
			float	levelStep		= isAutoLod ? 0.0f : 1.0f / (float)(de::max(1, m_textureSpec.numLevels-1)*m_textureSpec.depth);
			Vec4	cScale			= fmtInfo.valueMax-fmtInfo.valueMin;
			Vec4	cBias			= fmtInfo.valueMin;
			int		baseCellSize	= de::min(m_textureSpec.width/4, m_textureSpec.height/4);

			m_texture2DArray = new glu::Texture2DArray(m_renderCtx, m_textureSpec.format, m_textureSpec.width, m_textureSpec.height, m_textureSpec.depth);
			for (int level = 0; level < m_textureSpec.numLevels; level++)
			{
				m_texture2DArray->getRefTexture().allocLevel(level);
				tcu::PixelBufferAccess levelAccess = m_texture2DArray->getRefTexture().getLevel(level);

				for (int layer = 0; layer < levelAccess.getDepth(); layer++)
				{
					float	fA		= (float)layer*layerStep + (float)level*levelStep;
					float	fB		= 1.0f-fA;
					Vec4	colorA	= cBias + cScale*Vec4(fA, fB, fA, fB);
					Vec4	colorB	= cBias + cScale*Vec4(fB, fA, fB, fA);

					tcu::fillWithGrid(tcu::getSubregion(levelAccess, 0, 0, layer, levelAccess.getWidth(), levelAccess.getHeight(), 1), de::max(1, baseCellSize>>level), colorA, colorB);
				}
			}
			m_texture2DArray->upload();

			// Compute LOD.
			float dudx = (m_lookupSpec.maxCoord[0]-m_lookupSpec.minCoord[0])*proj*(float)m_textureSpec.width	/ (float)viewportSize[0];
			float dvdy = (m_lookupSpec.maxCoord[1]-m_lookupSpec.minCoord[1])*proj*(float)m_textureSpec.height	/ (float)viewportSize[1];
			m_lookupParams.lod = computeLodFromDerivates(DEFAULT_LOD_MODE, dudx, 0.0f, 0.0f, dvdy);

			// Append to texture list.
			m_textures.push_back(gls::TextureBinding(m_texture2DArray, m_textureSpec.sampler));
			break;
		}

		case TEXTURETYPE_3D:
		{
			float	levelStep		= isAutoLod ? 0.0f : 1.0f / (float)de::max(1, m_textureSpec.numLevels-1);
			Vec4	cScale			= fmtInfo.valueMax-fmtInfo.valueMin;
			Vec4	cBias			= fmtInfo.valueMin;
			int		baseCellSize	= de::min(de::min(m_textureSpec.width/2, m_textureSpec.height/2), m_textureSpec.depth/2);

			m_texture3D = new glu::Texture3D(m_renderCtx, m_textureSpec.format, m_textureSpec.width, m_textureSpec.height, m_textureSpec.depth);
			for (int level = 0; level < m_textureSpec.numLevels; level++)
			{
				float	fA		= (float)level*levelStep;
				float	fB		= 1.0f-fA;
				Vec4	colorA	= cBias + cScale*Vec4(fA, fB, fA, fB);
				Vec4	colorB	= cBias + cScale*Vec4(fB, fA, fB, fA);

				m_texture3D->getRefTexture().allocLevel(level);
				tcu::fillWithGrid(m_texture3D->getRefTexture().getLevel(level), de::max(1, baseCellSize>>level), colorA, colorB);
			}
			m_texture3D->upload();

			// Compute LOD.
			float dudx = (m_lookupSpec.maxCoord[0]-m_lookupSpec.minCoord[0])*proj*(float)m_textureSpec.width		/ (float)viewportSize[0];
			float dvdy = (m_lookupSpec.maxCoord[1]-m_lookupSpec.minCoord[1])*proj*(float)m_textureSpec.height		/ (float)viewportSize[1];
			float dwdx = (m_lookupSpec.maxCoord[2]-m_lookupSpec.minCoord[2])*0.5f*proj*(float)m_textureSpec.depth	/ (float)viewportSize[0];
			float dwdy = (m_lookupSpec.maxCoord[2]-m_lookupSpec.minCoord[2])*0.5f*proj*(float)m_textureSpec.depth	/ (float)viewportSize[1];
			m_lookupParams.lod = computeLodFromDerivates(DEFAULT_LOD_MODE, dudx, 0.0f, dwdx, 0.0f, dvdy, dwdy);

			// Append to texture list.
			m_textures.push_back(gls::TextureBinding(m_texture3D, m_textureSpec.sampler));
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
	}

	// Set lookup scale & bias
	m_lookupParams.scale	= fmtInfo.lookupScale;
	m_lookupParams.bias		= fmtInfo.lookupBias;
	m_lookupParams.offset	= m_lookupSpec.offset;
}